

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.hpp
# Opt level: O0

void __thiscall Omega_h::Graph::~Graph(Graph *this)

{
  Graph *this_local;
  
  Read<int>::~Read(&this->ab2b);
  Read<int>::~Read(&this->a2ab);
  return;
}

Assistant:

OMEGA_H_INLINE Graph() {}